

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-wizard.c
# Opt level: O2

_Bool wiz_create_item_action(menu_conflict *m,ui_event *e,wchar_t oid)

{
  long lVar1;
  menu_conflict *menu;
  wchar_t *pwVar2;
  ulong uVar3;
  char *fmt;
  int iVar4;
  long lVar5;
  _Bool _Var6;
  ui_event uVar7;
  wchar_t choice [70];
  char title [80];
  char buf [80];
  
  _Var6 = true;
  if (e->type == EVT_SELECT) {
    if (oid == L'\xffffd8f1') {
      cmdq_push((uint)!choose_artifact * 2 + CMD_WIZ_CREATE_ALL_ARTIFACT);
      _Var6 = false;
    }
    else {
      if (choose_artifact) {
        pwVar2 = &a_info[1].tval;
        iVar4 = 0;
        for (uVar3 = 1; (iVar4 < 0x3c && (uVar3 < z_info->a_max)); uVar3 = uVar3 + 1) {
          if (*pwVar2 == oid) {
            lVar5 = (long)iVar4;
            iVar4 = iVar4 + 1;
            choice[lVar5] = (wchar_t)uVar3;
          }
          pwVar2 = pwVar2 + 0x50;
        }
      }
      else {
        iVar4 = 0;
        lVar5 = 0x346;
        for (uVar3 = 1; (iVar4 < 0x3c && (uVar3 < z_info->k_max)); uVar3 = uVar3 + 1) {
          if ((*(wchar_t *)((long)k_info + lVar5 + -0x62) == oid) &&
             (_Var6 = flag_has_dbg(k_info->flags + lVar5 + -0x80,4,0x12,"kind->kind_flags",
                                   "KF_INSTA_ART"), !_Var6)) {
            lVar1 = (long)iVar4;
            iVar4 = iVar4 + 1;
            choice[lVar1] = (wchar_t)uVar3;
          }
          lVar5 = lVar5 + 0x2c0;
        }
      }
      choice[iVar4] = L'\xffffd8f1';
      choice[(long)iVar4 + 1] = oid;
      screen_save();
      clear_from(L'\0');
      menu = menu_new(MN_SKIN_COLUMNS,&wiz_create_item_submenu);
      menu->selections = "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
      object_base_name(buf,0x50,oid,true);
      fmt = "What kind of %s?";
      if (choose_artifact != false) {
        fmt = "Which artifact %s? ";
      }
      strnfmt(title,0x50,fmt,buf);
      menu->title = title;
      menu_setpriv(menu,iVar4 + 1,choice);
      menu_layout(menu,&wiz_create_item_area);
      uVar7 = menu_select(menu,0,false);
      screen_load();
      mem_free(menu);
      _Var6 = uVar7.type == EVT_ESCAPE;
    }
  }
  return _Var6;
}

Assistant:

static bool wiz_create_item_action(struct menu *m, const ui_event *e, int oid)
{
	ui_event ret;
	struct menu *menu;

	char buf[80];
	char title[80];

	int choice[70];
	int num;

	int i;

	if (e->type != EVT_SELECT) return true;

	if (oid == WIZ_CREATE_ALL_MENU_ITEM) {
		cmdq_push((choose_artifact) ? CMD_WIZ_CREATE_ALL_ARTIFACT :
			CMD_WIZ_CREATE_ALL_OBJ);
		return false;
	}

	/* Artifacts */
	if (choose_artifact) {
		/* ...We have to search the whole artifact list. */
		for (num = 0, i = 1; (num < 60) && (i < z_info->a_max); i++) {
			const struct artifact *art = &a_info[i];

			if (art->tval != oid) continue;

			choice[num++] = i;
		}
	} else {
		/* Regular objects */
		for (num = 0, i = 1; (num < 60) && (i < z_info->k_max); i++) {
			struct object_kind *kind = &k_info[i];

			if (kind->tval != oid ||
					kf_has(kind->kind_flags, KF_INSTA_ART))
				continue;

			choice[num++] = i;
		}
	}

	/*
	 * Add a flag for an "All <tval>" item to create all svals of that
	 * tval. The tval is stored (in a super hacky way) beyond the end of
	 * the valid menu items. The menu won't render it, but we can still
	 * get to it without doing a bunch of work.
	 */
	choice[num++] = WIZ_CREATE_ALL_MENU_ITEM;
	choice[num] = oid;

	screen_save();
	clear_from(0);

	menu = menu_new(MN_SKIN_COLUMNS, &wiz_create_item_submenu);
	menu->selections = all_letters;

	object_base_name(buf, sizeof(buf), oid, true);
	if (choose_artifact) {
		strnfmt(title, sizeof(title), "Which artifact %s? ", buf);
	} else {
		strnfmt(title, sizeof(title), "What kind of %s?", buf);
	}
	menu->title = title;

	menu_setpriv(menu, num, choice);
	menu_layout(menu, &wiz_create_item_area);
	ret = menu_select(menu, 0, false);

	screen_load();
	mem_free(menu);

	return (ret.type == EVT_ESCAPE);
}